

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<capnp::_::RawSchema_*&> __thiscall
kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
          (HashMap<unsigned_long,capnp::_::RawSchema*> *this,unsigned_long *key)

{
  Maybe<capnp::_::RawSchema_*&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> local_28;
  unsigned_long *local_20;
  unsigned_long *key_local;
  HashMap<unsigned_long,_capnp::_::RawSchema_*> *this_local;
  
  local_20 = key;
  key_local = (unsigned_long *)this;
  local_28 = Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
             ::find<0ul,unsigned_long&>
                       ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<capnp::_::RawSchema_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}